

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O3

void __thiscall
spdlog::logger::log_<int&,int&>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,int *args,int *args_1)

{
  __int_type_conflict _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t *psVar6;
  size_t sVar7;
  undefined1 *puVar8;
  format_args args_00;
  memory_buf_t buf;
  log_msg local_1c8;
  undefined8 local_168;
  undefined8 uStack_160;
  buffer<char> local_158;
  char local_138 [264];
  
  iVar2 = (this->level_).super___atomic_base<int>._M_i;
  _Var1 = (this->tracer_).enabled_._M_base._M_i;
  if (((int)lvl < iVar2 & (_Var1 ^ 1U)) == 0) {
    local_158.ptr_ = local_138;
    local_158.size_ = 0;
    local_158.grow_ =
         ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::grow;
    local_158.capacity_ = 0xfa;
    local_1c8.logger_name.data_._0_4_ = *args;
    local_1c8.level = *args_1;
    args_00.field_1.values_ = (value<fmt::v11::context> *)&local_1c8;
    args_00.desc_ = 0x11;
    ::fmt::v11::detail::vformat_to(&local_158,fmt,args_00,(locale_ref)0x0);
    sVar4 = local_158.size_;
    pcVar3 = local_158.ptr_;
    local_168 = (this->name_)._M_dataplus._M_p;
    uStack_160 = (this->name_)._M_string_length;
    local_1c8.time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_1c8.logger_name.data_._0_4_ = (undefined4)local_168;
    local_1c8.logger_name.data_._4_4_ = local_168._4_4_;
    local_1c8.logger_name.size_._0_4_ = (undefined4)uStack_160;
    local_1c8.logger_name.size_._4_4_ = uStack_160._4_4_;
    local_1c8.level = lvl;
    pcVar5 = (char *)__tls_get_addr(&PTR_0016fd40);
    if (*pcVar5 == '\0') {
      sVar7 = syscall(0xba);
      psVar6 = (size_t *)__tls_get_addr(&PTR_0016fe28);
      *psVar6 = sVar7;
      puVar8 = (undefined1 *)__tls_get_addr(&PTR_0016fd40);
      *puVar8 = 1;
    }
    else {
      psVar6 = (size_t *)__tls_get_addr(&PTR_0016fe28);
      sVar7 = *psVar6;
    }
    local_1c8.color_range_start = 0;
    local_1c8.color_range_end = 0;
    local_1c8.source.filename._0_4_ = loc.filename._0_4_;
    local_1c8.source.filename._4_4_ = loc.filename._4_4_;
    local_1c8.source.line = loc.line;
    local_1c8.source._12_4_ = loc._12_4_;
    local_1c8.source.funcname = loc.funcname;
    local_1c8.payload.data_ = pcVar3;
    local_1c8.payload.size_ = sVar4;
    local_1c8.thread_id = sVar7;
    if (iVar2 <= (int)lvl) {
      (*this->_vptr_logger[3])(this,&local_1c8);
    }
    if ((_Var1 & 1U) != 0) {
      details::backtracer::push_back(&this->tracer_,&local_1c8);
    }
    if (local_158.ptr_ != local_138) {
      free(local_158.ptr_);
    }
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }